

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall capnp::anon_unknown_79::Input::consumeWhitespace(Input *this)

{
  anon_class_1_0_00000001 local_11;
  Input *local_10;
  Input *this_local;
  
  local_10 = this;
  capnp::(anonymous_namespace)::Input::
  consumeWhile<capnp::(anonymous_namespace)::Input::consumeWhitespace()::_lambda(char)_1_>
            ((Input *)this,&local_11);
  return;
}

Assistant:

void consumeWhitespace() {
    consumeWhile([](char chr) {
      return (
        chr == ' '  ||
        chr == '\n' ||
        chr == '\r' ||
        chr == '\t'
      );
    });
  }